

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.cc
# Opt level: O3

int64_t __thiscall brown::MySimulator::linearSpeedCurve(MySimulator *this,int64_t tt)

{
  int64_t iVar1;
  
  if (linearSpeedCurve(long)::r2 == '\0') {
    linearSpeedCurve(this);
  }
  if (linearSpeedCurve(long)::rv0 == '\0') {
    linearSpeedCurve(this);
  }
  if (linearSpeedCurve(long)::a == '\0') {
    linearSpeedCurve();
  }
  if (linearSpeedCurve(long)::lt == '\0') {
    linearSpeedCurve(this);
  }
  if (tt < linearSpeedCurve::lt) {
    iVar1 = (int64_t)(this->super_Simulator).MAXT;
  }
  else {
    iVar1 = linearSpeedCurve::r2 /
            ((tt - linearSpeedCurve::lt) * linearSpeedCurve::a + linearSpeedCurve::rv0);
  }
  return iVar1;
}

Assistant:

std::int64_t MySimulator::linearSpeedCurve(std::int64_t tt) {
    static std::int64_t r2 = CLKFRQ * CLKFRQ;
    static std::int64_t rv0 = CLKFRQ * MINVEL;
    static std::int64_t a = MAXACC*4/5;
    static std::int64_t lt = MAXT*2; // low speed period

    std::int64_t vt = 0;
    if (tt < lt) {
        vt = MAXT;
    } else {
        vt = r2/(rv0 + a*(tt-lt));
    }
    return vt;
}